

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
UniQueue<FileTarget>::
emplace_back<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
          (UniQueue<FileTarget> *this,path *s,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1,PackFormat *s_2,
          long *s_3)

{
  reference pFVar1;
  pair<std::_Rb_tree_const_iterator<FileTarget>,_bool> pVar2;
  pair<std::_Rb_tree_const_iterator<FileTarget>,_bool> local_120;
  _Base_ptr local_110;
  _Base_ptr local_108;
  iterator local_100;
  const_iterator local_e0;
  _Map_pointer *local_c0;
  iterator local_b8;
  iterator local_98;
  undefined1 local_78 [8];
  _Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
  it;
  KEY key;
  undefined1 local_40 [8];
  pair<std::_Rb_tree_const_iterator<FileTarget>,_bool> r;
  long *s_local_3;
  PackFormat *s_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local_1;
  path *s_local;
  UniQueue<FileTarget> *this_local;
  
  r._8_8_ = s_3;
  if ((this->dirty & 1U) != 0) {
    cleanup(this,(EVP_PKEY_CTX *)s);
  }
  pVar2 = std::set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>>::
          emplace<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
                    ((set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>> *)
                     &this->unique,s,s_1,s_2,(long *)r._8_8_);
  local_40 = (undefined1  [8])pVar2.first._M_node;
  r.first._M_node._0_1_ = pVar2.second;
  pFVar1 = std::_Rb_tree_const_iterator<FileTarget>::operator*
                     ((_Rb_tree_const_iterator<FileTarget> *)local_40);
  it._M_node = (_Map_pointer)std::cref<FileTarget>(pFVar1);
  if (((byte)r.first._M_node & 1) == 0) {
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::begin(&local_98,
            &this->
             super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           );
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::end(&local_b8,
          &this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         );
    local_c0 = &it._M_node;
    std::
    find_if<std::_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>&,std::reference_wrapper<FileTarget_const>*>,UniQueue<FileTarget>::emplace_back<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>(std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&)::_lambda(std::reference_wrapper<FileTarget_const>const&)_1_>
              ((_Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
                *)local_78,&local_98,&local_b8,(anon_class_8_1_ba1d59bf_for__M_pred)local_c0);
    std::
    _Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>const&,std::reference_wrapper<FileTarget_const>const*>
    ::
    _Deque_iterator<std::_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>&,std::reference_wrapper<FileTarget_const>*>,void>
              ((_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>const&,std::reference_wrapper<FileTarget_const>const*>
                *)&local_e0,
               (_Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
                *)local_78);
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::erase(&local_100,
            &this->
             super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
            ,&local_e0);
    local_108 = (_Base_ptr)local_40;
    local_110 = (_Base_ptr)
                std::set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>>::
                erase_abi_cxx11_((set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>> *
                                 )&this->unique,(const_iterator)local_40);
    pVar2 = std::set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>>::
            emplace<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
                      ((set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>> *)
                       &this->unique,s,s_1,s_2,(long *)r._8_8_);
    local_120.first = pVar2.first._M_node;
    local_120.second = pVar2.second;
    std::pair<std::_Rb_tree_const_iterator<FileTarget>,_bool>::operator=
              ((pair<std::_Rb_tree_const_iterator<FileTarget>,_bool> *)local_40,&local_120);
    pFVar1 = std::_Rb_tree_const_iterator<FileTarget>::operator*
                       ((_Rb_tree_const_iterator<FileTarget> *)local_40);
    it._M_node = (_Map_pointer)std::cref<FileTarget>(pFVar1);
  }
  std::
  deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
  ::push_back(&this->
               super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
              ,(value_type *)&it._M_node);
  return;
}

Assistant:

void emplace_back(S&&... s)
    {
        if (dirty)
            cleanup();
        auto r = unique.emplace(std::forward<S>(s)...);
        KEY key = std::cref(*r.first);
        if (!r.second) { // If already present we must remove the prevous one in
                         // the deck
            auto it = std::find_if(
                PARENT::begin(), PARENT::end(),
                [&](const KEY& k) -> bool { return key.get() == k.get(); });
            PARENT::erase(it);
            unique.erase(r.first);
            r = unique.emplace(std::forward<S>(s)...);
            key = std::cref(*r.first);
        }
        PARENT::push_back(key);
    }